

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliX.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::PauliX<std::complex<double>_>::matrix(PauliX<std::complex<double>_> *this)

{
  complex<double> m10;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  data_type extraout_RDX_00;
  undefined8 in_RSI;
  undefined8 in_R8;
  SquareMatrix<std::complex<double>_> SVar1;
  complex<double> m00;
  complex<double> m01;
  PauliX<std::complex<double>_> *pPVar2;
  complex<double> in_stack_ffffffffffffffa8;
  complex<double> local_48;
  complex<double> local_38;
  complex<double> local_28;
  PauliX<std::complex<double>_> *this_local;
  
  pPVar2 = this;
  this_local = this;
  std::complex<double>::complex(&local_28,0.0,0.0);
  std::complex<double>::complex(&local_38,1.0,0.0);
  std::complex<double>::complex(&local_48,1.0,0.0);
  std::complex<double>::complex((complex<double> *)&stack0xffffffffffffffa8,0.0,0.0);
  m10._M_value._8_8_ = pPVar2;
  m10._M_value._0_8_ = this;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = in_RSI;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = in_RCX;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,m00,m01,m10,in_stack_ffffffffffffffa8);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX_00._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)pPVar2;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 0 , 1 ,
                                                  1 , 0 ) ;
        }